

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O1

int t1_init_ctxno_sc(int f)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  
  bVar2 = ((f & 0x880U) == 0x80) + ((f & 0x220U) == 0x20);
  bVar4 = ((f & 0x880U) == 0x880) + ((f & 0x220U) == 0x220);
  if (bVar4 != 0) {
    bVar4 = 1;
  }
  iVar5 = (uint)((f & 0x440U) == 0x40) + (uint)((f & 0x110U) == 0x10);
  if (iVar5 != 0) {
    iVar5 = 1;
  }
  iVar6 = (uint)((f & 0x440U) == 0x440) + (uint)((f & 0x110U) == 0x110);
  if (iVar6 != 0) {
    iVar6 = 1;
  }
  iVar1 = -(iVar5 - iVar6);
  if (bVar4 <= bVar2) {
    iVar1 = iVar5 - iVar6;
  }
  uVar3 = 0xb;
  if (iVar1 != -1) {
    uVar3 = iVar1 == 0 ^ 0xd;
  }
  if ((bVar2 != 0) == (bool)bVar4) {
    uVar3 = 10 - (iVar1 == 0);
  }
  return uVar3;
}

Assistant:

static int t1_init_ctxno_sc(int f) {
	int hc, vc, n;
	n = 0;

	hc = opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
				T1_SIG_E) + ((f & (T1_SIG_W | T1_SGN_W)) == T1_SIG_W),
			1) - opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
					(T1_SIG_E | T1_SGN_E)) +
				((f & (T1_SIG_W | T1_SGN_W)) ==
				 (T1_SIG_W | T1_SGN_W)), 1);

	vc = opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
				T1_SIG_N) + ((f & (T1_SIG_S | T1_SGN_S)) == T1_SIG_S),
			1) - opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
					(T1_SIG_N | T1_SGN_N)) +
				((f & (T1_SIG_S | T1_SGN_S)) ==
				 (T1_SIG_S | T1_SGN_S)), 1);

	if (hc < 0) {
		hc = -hc;
		vc = -vc;
	}
	if (!hc) {
		if (vc == -1)
			n = 1;
		else if (!vc)
			n = 0;
		else
			n = 1;
	} else if (hc == 1) {
		if (vc == -1)
			n = 2;
		else if (!vc)
			n = 3;
		else
			n = 4;
	}

	return (T1_CTXNO_SC + n);
}